

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::SmallVector<diligent_spirv_cross::BuiltInResource,_8UL>::push_back
          (SmallVector<diligent_spirv_cross::BuiltInResource,_8UL> *this,BuiltInResource *t)

{
  BuiltInResource *t_local;
  SmallVector<diligent_spirv_cross::BuiltInResource,_8UL> *this_local;
  
  reserve(this,(this->super_VectorView<diligent_spirv_cross::BuiltInResource>).buffer_size + 1);
  BuiltInResource::BuiltInResource
            ((this->super_VectorView<diligent_spirv_cross::BuiltInResource>).ptr +
             (this->super_VectorView<diligent_spirv_cross::BuiltInResource>).buffer_size,t);
  (this->super_VectorView<diligent_spirv_cross::BuiltInResource>).buffer_size =
       (this->super_VectorView<diligent_spirv_cross::BuiltInResource>).buffer_size + 1;
  return;
}

Assistant:

void push_back(T &&t) SPIRV_CROSS_NOEXCEPT
	{
		reserve(this->buffer_size + 1);
		new (&this->ptr[this->buffer_size]) T(std::move(t));
		this->buffer_size++;
	}